

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

void __thiscall xe::TestResultParser::pushItem(TestResultParser *this,Item *item)

{
  Item *local_10;
  
  local_10 = item;
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::push_back
            (&this->m_itemStack,&local_10);
  updateCurrentItemList(this);
  return;
}

Assistant:

void TestResultParser::pushItem (ri::Item* item)
{
	m_itemStack.push_back(item);
	updateCurrentItemList();
}